

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

void __thiscall Js::TypedArrayBase::Set(TypedArrayBase *this,TypedArrayBase *source,uint32 offset)

{
  uint length;
  Type *pTVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  JavascriptArray *pJVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  uint32 i;
  
  length = (source->super_ArrayBufferParent).super_ArrayObject.length;
  if ((CARRY4(length,offset)) ||
     ((this->super_ArrayBufferParent).super_ArrayObject.length < length + offset)) {
    JavascriptError::ThrowRangeError
              ((((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ec24,(PCWSTR)0x0);
  }
  pTVar1 = (this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr;
  if (((source->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
    JavascriptError::ThrowTypeError
              ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
               -0x7ff5ebe5,(PCWSTR)0x0);
  }
  if ((pTVar1->typeId !=
       ((source->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.type.ptr)->typeId) &&
     (((this->BYTES_PER_ELEMENT != source->BYTES_PER_ELEMENT ||
       (((bVar2 = VarIsImpl<Js::TypedArray<unsigned_char,true,false>>((RecyclableObject *)this),
         bVar2 || (bVar2 = VarIsImpl<Js::TypedArray<unsigned_char,true,true>>
                                     ((RecyclableObject *)this), bVar2)) &&
        ((bVar2 = VarIsImpl<Js::TypedArray<char,false,false>>((RecyclableObject *)source), bVar2 ||
         (bVar2 = VarIsImpl<Js::TypedArray<char,false,true>>((RecyclableObject *)source), bVar2)))))
       ) || ((((((bVar2 = VarIsImpl<Js::TypedArray<float,false,false>>((RecyclableObject *)this),
                 bVar2 || (bVar2 = VarIsImpl<Js::TypedArray<float,false,false>>
                                             ((RecyclableObject *)source), bVar2)) ||
                (bVar2 = VarIsImpl<Js::TypedArray<float,false,true>>((RecyclableObject *)this),
                bVar2)) ||
               ((bVar2 = VarIsImpl<Js::TypedArray<float,false,true>>((RecyclableObject *)source),
                bVar2 || (bVar2 = VarIsImpl<Js::TypedArray<double,false,false>>
                                            ((RecyclableObject *)this), bVar2)))) ||
              (bVar2 = VarIsImpl<Js::TypedArray<double,false,false>>((RecyclableObject *)source),
              bVar2)) ||
             ((bVar2 = VarIsImpl<Js::TypedArray<double,false,true>>((RecyclableObject *)this), bVar2
              || (bVar2 = VarIsImpl<Js::TypedArray<double,false,true>>((RecyclableObject *)source),
                 bVar2)))))))) {
    if ((source->super_ArrayBufferParent).arrayBuffer.ptr ==
        (this->super_ArrayBufferParent).arrayBuffer.ptr) {
      pJVar5 = JavascriptLibrary::CreateArray
                         ((((((((this->super_ArrayBufferParent).super_ArrayObject.
                                super_DynamicObject.super_RecyclableObject.type.ptr)->
                              javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                           ptr)->super_ScriptContextBase).javascriptLibrary,length);
      if (length != 0) {
        uVar4 = 0;
        do {
          iVar3 = (*(source->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(source,uVar4);
          (*(pJVar5->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (pJVar5,uVar4,CONCAT44(extraout_var_00,iVar3),0);
          uVar6 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar6;
        } while (length != uVar6);
        uVar6 = 0;
        do {
          iVar3 = (*(pJVar5->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(pJVar5,(ulong)uVar6);
          (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])
                    (this,(ulong)(offset + uVar6),CONCAT44(extraout_var_01,iVar3));
          uVar6 = uVar6 + 1;
        } while (length != uVar6);
      }
    }
    else if (length != 0) {
      uVar6 = 0;
      do {
        iVar3 = (*(source->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x74])(source,(ulong)uVar6);
        (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x73])
                  (this,(ulong)(offset + uVar6),CONCAT44(extraout_var,iVar3));
        uVar6 = uVar6 + 1;
      } while (length != uVar6);
    }
    if ((((source->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == false) &&
       (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true)) {
      return;
    }
    Throw::FatalInternalError(-0x7fffbffb);
  }
  uVar4 = (ulong)(offset * this->BYTES_PER_ELEMENT);
  memmove_s(this->buffer + uVar4,
            this->BYTES_PER_ELEMENT * (this->super_ArrayBufferParent).super_ArrayObject.length -
            uVar4,source->buffer,
            (ulong)(source->BYTES_PER_ELEMENT *
                   (source->super_ArrayBufferParent).super_ArrayObject.length));
  return;
}

Assistant:

void TypedArrayBase::Set(TypedArrayBase* source, uint32 offset)
    {
        uint32 sourceLength = source->GetLength();
        uint32 totalLength;

        if (UInt32Math::Add(offset, sourceLength, &totalLength) ||
            (totalLength > GetLength()))
        {
            JavascriptError::ThrowRangeError(
                GetScriptContext(), JSERR_InvalidTypedArrayLength);
        }

        if (source->IsDetachedBuffer())
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
        }

        // memmove buffer if views have same bit representation.
        // types of the same size are compatible, with the following exceptions:
        // - we cannot memmove between float and int arrays, due to different bit pattern
        // - we cannot memmove to a uint8 clamped array from an int8 array, due to negatives rounding to 0
        if (GetTypeId() == source->GetTypeId() ||
            (GetBytesPerElement() == source->GetBytesPerElement()
             && !((VarIs<Uint8ClampedArray>(this) || VarIs<Uint8ClampedVirtualArray>(this)) && (VarIs<Int8Array>(source) || VarIs<Int8VirtualArray>(source)))
             && !VarIs<Float32Array>(this) && !VarIs<Float32Array>(source)
             && !VarIs<Float32VirtualArray>(this) && !VarIs<Float32VirtualArray>(source)
             && !VarIs<Float64Array>(this) && !VarIs<Float64Array>(source)
             && !VarIs<Float64VirtualArray>(this) && !VarIs<Float64VirtualArray>(source)))
        {
            const size_t offsetInBytes = offset * BYTES_PER_ELEMENT;
            memmove_s(buffer + offsetInBytes,
                      GetByteLength() - offsetInBytes,
                      source->GetByteBuffer(),
                      source->GetByteLength());
        }
        else
        {
            if (source->GetArrayBuffer() != GetArrayBuffer())
            {
                for (uint32 i = 0; i < sourceLength; i++)
                {
                    DirectSetItemNoDetachCheck(offset + i, source->DirectGetItemNoDetachCheck(i));
                }
            }
            else
            {
                // We can have the source and destination coming from the same buffer. element size, start offset, and
                // length for source and dest typed array can be different. Use a separate tmp buffer to copy the elements.
                Js::JavascriptArray* tmpArray = GetScriptContext()->GetLibrary()->CreateArray(sourceLength);
                for (uint32 i = 0; i < sourceLength; i++)
                {
                    tmpArray->SetItem(i, source->DirectGetItem(i), PropertyOperation_None);
                }
                for (uint32 i = 0; i < sourceLength; i++)
                {
                    DirectSetItem(offset + i, tmpArray->DirectGetItem(i));
                }
            }
            if (source->IsDetachedBuffer() || this->IsDetachedBuffer())
            {
                Throw::FatalInternalError();
            }
        }
    }